

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_has_filter(bcf_hdr_t *hdr,bcf1_t *line,char *filter)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((*filter == '.') && (filter[1] == '\0')) {
    filter = "PASS";
  }
  uVar1 = bcf_hdr_id2int(hdr,0,filter);
  iVar2 = -1;
  if ((-1 < (int)uVar1) && ((~(hdr->id[0][uVar1].val)->info[0] & 0xf) != 0)) {
    if ((line->unpacked & 2) == 0) {
      bcf_unpack(line,2);
    }
    if ((uVar1 == 0) && ((line->d).n_flt == 0)) {
LAB_00120272:
      iVar2 = 1;
    }
    else {
      lVar3 = (long)(line->d).n_flt;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          if ((line->d).flt[lVar4] == uVar1) goto LAB_00120272;
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int bcf_has_filter(const bcf_hdr_t *hdr, bcf1_t *line, char *filter)
{
    if ( filter[0]=='.' && !filter[1] ) filter = "PASS";
    int id = bcf_hdr_id2int(hdr, BCF_DT_ID, filter);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FLT,id) ) return -1;  // not defined in the header

    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    if ( id==0 && !line->d.n_flt) return 1; // PASS

    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( line->d.flt[i]==id ) return 1;
    return 0;
}